

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_enc_dec.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint symSize_00;
  uint K;
  int iVar1;
  undefined8 uVar2;
  string *psVar3;
  char **in_RSI;
  int in_EDI;
  int status;
  int c;
  string outputEsiStr;
  string inputEsiStr;
  string outputFname;
  string inputFname;
  int symSize;
  int Kval;
  allocator<char> *in_stack_fffffffffffffea0;
  allocator<char> *__a;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  string local_130;
  string local_110;
  string local_f0;
  int local_cc;
  int local_c8;
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [39];
  allocator<char> local_71;
  string local_70 [55];
  allocator<char> local_39;
  string local_38 [32];
  uint local_18;
  uint local_14;
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 5;
  local_18 = 0x200;
  __s = &local_39;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb0,(char *)__s,in_stack_fffffffffffffea0);
  std::allocator<char>::~allocator(&local_39);
  __a = &local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffeb0,(char *)__s,__a);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffeb0,(char *)__s,__a);
  std::allocator<char>::~allocator(&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffeb0,(char *)__s,__a);
  std::allocator<char>::~allocator(&local_c1);
  while (local_c8 = getopt(local_8,local_10,"hi:T:K:o:I:O:"), local_c8 != -1) {
    switch(local_c8) {
    case 0x3f:
      exit(1);
    case 0x49:
      std::__cxx11::string::operator=(local_98,_optarg);
      break;
    case 0x4b:
      local_14 = atoi(_optarg);
      break;
    case 0x4f:
      std::__cxx11::string::operator=(local_c0,_optarg);
      break;
    case 0x54:
      local_18 = atoi(_optarg);
      break;
    case 0x68:
      usage();
      break;
    case 0x69:
      std::__cxx11::string::operator=(local_38,_optarg);
      break;
    case 0x6f:
      std::__cxx11::string::operator=(local_70,_optarg);
    }
  }
  printf("Settings used: \n");
  printf("K: %d\n",(ulong)local_14);
  printf("Symbol size: %d\n",(ulong)local_18);
  uVar2 = std::__cxx11::string::c_str();
  printf("Input Filename: %s\n",uVar2);
  uVar2 = std::__cxx11::string::c_str();
  printf("Output Filename: %s\n",uVar2);
  psVar3 = expandEsiStr(_c);
  std::__cxx11::string::operator=(local_98,(string *)psVar3);
  uVar2 = std::__cxx11::string::c_str();
  printf("Input ESI string: %s\n",uVar2);
  psVar3 = expandEsiStr(_c);
  std::__cxx11::string::operator=(local_c0,(string *)psVar3);
  uVar2 = std::__cxx11::string::c_str();
  printf("Output ESI string: %s\n",uVar2);
  K = local_14;
  symSize_00 = local_18;
  local_cc = 0;
  std::__cxx11::string::string((string *)&local_f0,local_38);
  std::__cxx11::string::string((string *)&local_110,local_70);
  std::__cxx11::string::string((string *)&local_130,local_98);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffeb0,local_c0);
  iVar1 = transcode(K,symSize_00,&local_f0,&local_110,&local_130,(string *)&stack0xfffffffffffffeb0)
  ;
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  if (iVar1 == 0) {
    printf("--> Failed\n\n");
    local_cc = 1;
  }
  else {
    printf("--> Succeeded\n\n");
  }
  local_4 = local_cc;
  std::__cxx11::string::~string(local_c0);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
    int Kval = 5;
    int symSize = 512;

    string inputFname = "input.bin";
    string outputFname = "output.bin";
    string inputEsiStr = "";
    string outputEsiStr = "";


    /* scan command lines */
    int c;
    while ((c = getopt(argc, argv, "hi:T:K:o:I:O:")) != -1) {
        switch (c) {
        case 'h':
            usage();
            break;
        case 'i':
            inputFname = optarg;
            break;
        case 'o':
            outputFname = optarg;
            break;
        case 'I':
            inputEsiStr = optarg;
            break;
        case 'O':
            outputEsiStr = optarg;
            break;
        case 'T':
            symSize = atoi(optarg);
            break;
        case 'K':
            Kval = atoi(optarg);
            break;
        case '?':
            exit(EXIT_FAILURE);
        };
    }

    /* Dump the input arguments */
    printf ("Settings used: \n");
    printf ("K: %d\n", Kval);
    printf ("Symbol size: %d\n", symSize);
    printf ("Input Filename: %s\n", inputFname.c_str());
    printf ("Output Filename: %s\n", outputFname.c_str());
    inputEsiStr = expandEsiStr(inputEsiStr);
    printf ("Input ESI string: %s\n", inputEsiStr.c_str());
    outputEsiStr = expandEsiStr(outputEsiStr);
    printf ("Output ESI string: %s\n", outputEsiStr.c_str());

    /* Encode/Decode */
    int status = 0;

    if (transcode(Kval, symSize, inputFname, outputFname, inputEsiStr, outputEsiStr)) {
        printf("--> Succeeded\n\n");
    } else {
        printf("--> Failed\n\n");
        status = 1;
    }

    return status;
}